

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O2

void __thiscall ftxui::anon_unknown_0::Text::Render(Text *this,Screen *screen)

{
  int y;
  bool bVar1;
  Pixel *pPVar2;
  pointer __lhs;
  int x;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  y = (this->super_Node).box_.y_min;
  if (y <= (this->super_Node).box_.y_max) {
    x = (this->super_Node).box_.x_min;
    Utf8ToGlyphs(&local_48,&this->text_);
    __lhs = local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    while ((__lhs != local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish &&
           (x <= (this->super_Node).box_.x_max))) {
      bVar1 = std::operator==(__lhs,"\n");
      if (!bVar1) {
        pPVar2 = Screen::PixelAt(screen,x,y);
        std::__cxx11::string::_M_assign((string *)&pPVar2->character);
        x = x + 1;
      }
      __lhs = __lhs + 1;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
  }
  return;
}

Assistant:

void Render(Screen& screen) override {
    int x = box_.x_min;
    const int y = box_.y_min;
    if (y > box_.y_max) {
      return;
    }
    for (const auto& cell : Utf8ToGlyphs(text_)) {
      if (x > box_.x_max) {
        return;
      }
      if (cell == "\n") {
        continue;
      }
      screen.PixelAt(x, y).character = cell;
      ++x;
    }
  }